

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_reflection_class.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::ReflectionClassGenerator::WriteGeneratedCodeInfo
          (ReflectionClassGenerator *this,Descriptor *descriptor,Printer *printer,bool last)

{
  Printer *pPVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FieldDescriptor *this_00;
  OneofDescriptor *this_01;
  string *input;
  EnumDescriptor *this_02;
  Descriptor *descriptor_00;
  Descriptor *descriptor_01;
  FieldDescriptor *descriptor_02;
  EnumDescriptor *descriptor_03;
  char *text;
  int local_17c;
  undefined1 local_178 [4];
  int i_3;
  string local_158;
  int local_134;
  undefined1 local_130 [4];
  int i_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enums;
  string local_f8;
  int local_d4;
  undefined1 local_d0 [4];
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  oneofs;
  string local_98;
  int local_74;
  undefined1 local_70 [4];
  int i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fields;
  string local_48;
  byte local_21;
  Printer *pPStack_20;
  bool last_local;
  Printer *printer_local;
  Descriptor *descriptor_local;
  ReflectionClassGenerator *this_local;
  
  local_21 = last;
  pPStack_20 = printer;
  printer_local = (Printer *)descriptor;
  descriptor_local = (Descriptor *)this;
  bVar2 = IsMapEntryMessage(descriptor);
  pPVar1 = pPStack_20;
  if (bVar2) {
    io::Printer::Print(pPStack_20,"null, ");
  }
  else {
    GetClassName_abi_cxx11_(&local_48,(csharp *)printer_local,descriptor_01);
    io::Printer::Print(pPVar1,
                       "new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ",
                       "type_name",&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    iVar3 = Descriptor::field_count((Descriptor *)printer_local);
    if (iVar3 < 1) {
      io::Printer::Print(pPStack_20,"null, ");
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_70);
      local_74 = 0;
      while( true ) {
        iVar3 = local_74;
        iVar4 = Descriptor::field_count((Descriptor *)printer_local);
        pPVar1 = pPStack_20;
        if (iVar4 <= iVar3) break;
        this_00 = Descriptor::field((Descriptor *)printer_local,local_74);
        GetPropertyName_abi_cxx11_(&local_98,(csharp *)this_00,descriptor_02);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_70,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        local_74 = local_74 + 1;
      }
      JoinStrings((string *)
                  &oneofs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_70,"\", \"");
      io::Printer::Print(pPVar1,"new[]{ \"$fields$\" }, ","fields",
                         (string *)
                         &oneofs.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &oneofs.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_70);
    }
    iVar3 = Descriptor::oneof_decl_count((Descriptor *)printer_local);
    if (iVar3 < 1) {
      io::Printer::Print(pPStack_20,"null, ");
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_d0);
      local_d4 = 0;
      while( true ) {
        iVar3 = local_d4;
        iVar4 = Descriptor::oneof_decl_count((Descriptor *)printer_local);
        pPVar1 = pPStack_20;
        if (iVar4 <= iVar3) break;
        this_01 = Descriptor::oneof_decl((Descriptor *)printer_local,local_d4);
        input = OneofDescriptor::name_abi_cxx11_(this_01);
        UnderscoresToCamelCase(&local_f8,input,true);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d0,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        local_d4 = local_d4 + 1;
      }
      JoinStrings((string *)
                  &enums.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_d0,"\", \"");
      io::Printer::Print(pPVar1,"new[]{ \"$oneofs$\" }, ","oneofs",
                         (string *)
                         &enums.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &enums.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_d0);
    }
    iVar3 = Descriptor::enum_type_count((Descriptor *)printer_local);
    if (iVar3 < 1) {
      io::Printer::Print(pPStack_20,"null, ");
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_130);
      local_134 = 0;
      while( true ) {
        iVar3 = local_134;
        iVar4 = Descriptor::enum_type_count((Descriptor *)printer_local);
        pPVar1 = pPStack_20;
        if (iVar4 <= iVar3) break;
        this_02 = Descriptor::enum_type((Descriptor *)printer_local,local_134);
        GetClassName_abi_cxx11_(&local_158,(csharp *)this_02,descriptor_03);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_130,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        local_134 = local_134 + 1;
      }
      JoinStrings((string *)local_178,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_130,"), typeof(");
      io::Printer::Print(pPVar1,"new[]{ typeof($enums$) }, ","enums",(string *)local_178);
      std::__cxx11::string::~string((string *)local_178);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_130);
    }
    iVar3 = Descriptor::nested_type_count((Descriptor *)printer_local);
    if (iVar3 < 1) {
      io::Printer::Print(pPStack_20,"null");
    }
    else {
      io::Printer::Print(pPStack_20,"new pbr::GeneratedClrTypeInfo[] { ");
      local_17c = 0;
      while( true ) {
        iVar3 = Descriptor::nested_type_count((Descriptor *)printer_local);
        if (iVar3 <= local_17c) break;
        descriptor_00 = Descriptor::nested_type((Descriptor *)printer_local,local_17c);
        pPVar1 = pPStack_20;
        iVar3 = Descriptor::nested_type_count((Descriptor *)printer_local);
        WriteGeneratedCodeInfo(this,descriptor_00,pPVar1,local_17c == iVar3 + -1);
        local_17c = local_17c + 1;
      }
      io::Printer::Print(pPStack_20,"}");
    }
    text = "),\n";
    if ((local_21 & 1) != 0) {
      text = ")";
    }
    io::Printer::Print(pPStack_20,text);
  }
  return;
}

Assistant:

void ReflectionClassGenerator::WriteGeneratedCodeInfo(const Descriptor* descriptor, io::Printer* printer, bool last) {
  if (IsMapEntryMessage(descriptor)) {
    printer->Print("null, ");
    return;
  }
  // Generated message type
  printer->Print("new pbr::GeneratedClrTypeInfo(typeof($type_name$), $type_name$.Parser, ", "type_name", GetClassName(descriptor));
  
  // Fields
  if (descriptor->field_count() > 0) {
      std::vector<std::string> fields;
      for (int i = 0; i < descriptor->field_count(); i++) {
          fields.push_back(GetPropertyName(descriptor->field(i)));
      }
      printer->Print("new[]{ \"$fields$\" }, ", "fields", JoinStrings(fields, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Oneofs
  if (descriptor->oneof_decl_count() > 0) {
      std::vector<std::string> oneofs;
      for (int i = 0; i < descriptor->oneof_decl_count(); i++) {
          oneofs.push_back(UnderscoresToCamelCase(descriptor->oneof_decl(i)->name(), true));
      }
      printer->Print("new[]{ \"$oneofs$\" }, ", "oneofs", JoinStrings(oneofs, "\", \""));
  }
  else {
      printer->Print("null, ");
  }

  // Nested enums
  if (descriptor->enum_type_count() > 0) {
      std::vector<std::string> enums;
      for (int i = 0; i < descriptor->enum_type_count(); i++) {
          enums.push_back(GetClassName(descriptor->enum_type(i)));
      }
      printer->Print("new[]{ typeof($enums$) }, ", "enums", JoinStrings(enums, "), typeof("));
  }
  else {
      printer->Print("null, ");
  }

  // Nested types
  if (descriptor->nested_type_count() > 0) {
      // Need to specify array type explicitly here, as all elements may be null. 
      printer->Print("new pbr::GeneratedClrTypeInfo[] { ");
      for (int i = 0; i < descriptor->nested_type_count(); i++) {
          WriteGeneratedCodeInfo(descriptor->nested_type(i), printer, i == descriptor->nested_type_count() - 1);
      }
      printer->Print("}");
  }
  else {
      printer->Print("null");
  }
  printer->Print(last ? ")" : "),\n");
}